

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  uint uVar1;
  InternalRunDeathTestFlag *pIVar2;
  TestInfo *pTVar3;
  int iVar4;
  int iVar5;
  TestRole TVar6;
  UnitTestImpl *pUVar7;
  void *__addr;
  int *piVar8;
  undefined8 extraout_RAX;
  size_t sVar9;
  size_t __len;
  int pipe_fd [2];
  ExecDeathTestArgs args_1;
  String local_68;
  Arguments args;
  String internal_flag;
  String filter_flag;
  
  pUVar7 = GetUnitTestImpl();
  pIVar2 = (pUVar7->internal_run_death_test_flag_).ptr_;
  if (pIVar2 == (InternalRunDeathTestFlag *)0x0) {
    pTVar3 = pUVar7->current_test_info_;
    uVar1 = (pTVar3->result_).death_test_count_;
    iVar4 = pipe(pipe_fd);
    if (iVar4 == -1) {
      String::Format((char *)&args,"CHECK failed: File %s, line %d: %s",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/googletest/src/gtest-death-test.cc"
                     ,0x3ec,"pipe(pipe_fd) != -1");
      DeathTestAbort((String *)&args);
    }
    else {
      iVar4 = fcntl(pipe_fd[1],2,0);
      if (iVar4 != -1) {
        String::Format((char *)&filter_flag,"--%s%s=%s.%s","gtest_","filter",
                       (pTVar3->test_case_name_)._M_dataplus._M_p,(pTVar3->name_)._M_dataplus._M_p);
        String::Format((char *)&internal_flag,"--%s%s=%s|%d|%d|%d","gtest_",
                       "internal_run_death_test",this->file_,(ulong)(uint)this->line_,(ulong)uVar1,
                       (ulong)(uint)pipe_fd[1]);
        Arguments::Arguments(&args);
        Arguments::AddArguments<testing::internal::String>
                  (&args,(vector<testing::internal::String,_std::allocator<testing::internal::String>_>
                          *)g_argvs);
        Arguments::AddArgument(&args,filter_flag.c_str_);
        Arguments::AddArgument(&args,internal_flag.c_str_);
        String::String((String *)&args_1,"");
        DeathTest::set_last_death_test_message((String *)&args_1);
        String::~String((String *)&args_1);
        CaptureStderr();
        FlushInfoLog();
        args_1.argv = args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
        args_1.close_fd = pipe_fd[0];
        if (FLAGS_gtest_death_test_use_fork != '\0') {
          iVar4 = fork();
          if (iVar4 == 0) goto LAB_001241ba;
          goto LAB_0012409e;
        }
        if (ExecDeathTestFork(char_const**,int)::stack_grows_down == '\0') goto LAB_001241c4;
        goto LAB_00124033;
      }
    }
    this = (ExecDeathTest *)&args;
    String::Format((char *)this,"CHECK failed: File %s, line %d: %s",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/googletest/src/gtest-death-test.cc"
                   ,0x3ef,"fcntl(pipe_fd[1], F_SETFD, 0) != -1");
    DeathTestAbort((String *)this);
    do {
      String::Format((char *)&local_68,"CHECK failed: File %s, line %d: %s",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/googletest/src/gtest-death-test.cc"
                     ,0x3d7,"child_pid != -1");
      DeathTestAbort(&local_68);
LAB_001241ba:
      ExecDeathTestChildMain(&args_1);
LAB_001241c4:
      iVar4 = __cxa_guard_acquire();
      if (iVar4 != 0) {
        ExecDeathTestFork(char_const**,int)::stack_grows_down = StackGrowsDown();
        __cxa_guard_release();
      }
LAB_00124033:
      iVar4 = getpagesize();
      __len = (size_t)iVar4;
      __addr = mmap((void *)0x0,__len,3,0x22,-1,0);
      if (__addr == (void *)0xffffffffffffffff) {
        String::Format((char *)&local_68,"CHECK failed: File %s, line %d: %s",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/googletest/src/gtest-death-test.cc"
                       ,0x3c6,"stack != MAP_FAILED");
        DeathTestAbort(&local_68);
LAB_00124224:
        String::Format((char *)&local_68,"CHECK failed: File %s, line %d: %s",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/googletest/src/gtest-death-test.cc"
                       ,0x3cc,"munmap(stack, stack_size) != -1");
        DeathTestAbort(&local_68);
        String::~String(&local_68);
        Arguments::~Arguments(&args);
        String::~String(&internal_flag);
        String::~String(&filter_flag);
        _Unwind_Resume(extraout_RAX);
      }
      sVar9 = 0;
      if (ExecDeathTestFork(char_const**,int)::stack_grows_down != '\0') {
        sVar9 = __len;
      }
      iVar4 = clone(ExecDeathTestChildMain,(void *)(sVar9 + (long)__addr),0x11,&args_1);
      iVar5 = munmap(__addr,__len);
      if (iVar5 == -1) goto LAB_00124224;
LAB_0012409e:
    } while (iVar4 == -1);
    do {
      iVar5 = close(pipe_fd[1]);
      if (iVar5 != -1) goto LAB_001240ef;
      piVar8 = __errno_location();
    } while (*piVar8 == 4);
    String::Format((char *)&args_1,"CHECK failed: File %s, line %d: %s != -1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/googletest/src/gtest-death-test.cc"
                   ,0x406,"close(pipe_fd[1])");
    DeathTestAbort((String *)&args_1);
LAB_001240ef:
    *(int *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x2c = iVar4;
    (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = pipe_fd[0];
    (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
    Arguments::~Arguments(&args);
    String::~String(&internal_flag);
    String::~String(&filter_flag);
    TVar6 = OVERSEE_TEST;
  }
  else {
    (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pIVar2->write_fd_;
    TVar6 = EXECUTE_TEST;
  }
  return TVar6;
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != NULL) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const String filter_flag =
      String::Format("--%s%s=%s.%s",
                     GTEST_FLAG_PREFIX_, kFilterFlag,
                     info->test_case_name(), info->name());
  const String internal_flag =
      String::Format("--%s%s=%s|%d|%d|%d",
                     GTEST_FLAG_PREFIX_, kInternalRunDeathTestFlag,
                     file_, line_, death_test_index, pipe_fd[1]);
  Arguments args;
  args.AddArguments(GetArgvs());
  args.AddArgument(filter_flag.c_str());
  args.AddArgument(internal_flag.c_str());

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  const pid_t child_pid = ExecDeathTestFork(args.Argv(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}